

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChooseGenerator.cpp
# Opt level: O2

void __thiscall AxA_isGreaterThan_A::AxA_isGreaterThan_A(AxA_isGreaterThan_A *this)

{
  Generator<int> local_20;
  long *local_18;
  
  cppqc::choose<int>((cppqc *)&local_18,2,1000);
  local_20.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl =
       (unique_ptr<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
        )(**(code **)(*local_18 + 0x20))();
  cppqc::
  Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  ::Property(&this->
              super_Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
             ,&local_20);
  if (local_20.m_gen._M_t.
      super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
      .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl !=
      (__uniq_ptr_data<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_20.m_gen._M_t.
                          super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
                          .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>.
                          _M_head_impl + 8))();
  }
  local_20.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl =
       (unique_ptr<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
        )(__uniq_ptr_data<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>,_true,_true>
          )0x0;
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  (this->
  super_Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  ).super_PropertyBase._vptr_PropertyBase = (_func_int **)&PTR_expect_0010dc08;
  return;
}

Assistant:

AxA_isGreaterThan_A() : Property(cppqc::choose(MIN, MAX)) {}